

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O3

void init_emulator(Emulator *e,Buffer *rom)

{
  size_t sVar1;
  
  memset(e,0,0x800f8);
  (e->state).reg[0x15] = 0xf0;
  sVar1 = rom->size;
  (e->rom).data = rom->data;
  (e->rom).size = sVar1;
  (e->state).pc = 0xe000480;
  (e->state).pipeline.if_.s.active = true;
  return;
}

Assistant:

void init_emulator(Emulator* e, Buffer* rom) {
  ZERO_MEMORY(*e);
  e->verbosity = 0;
  e->state.reg[REGISTER_SR] = 0xf0;
  e->rom = *rom;
  e->state.pc = 0x0e000480;
  e->state.pipeline.if_.s.active = true;
}